

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O3

int appendDynamic(dynamicPtr *dp,void *src,int size)

{
  int in_EAX;
  int iVar1;
  int iVar2;
  void *pvVar3;
  
  if (dp->dataGood == 0) {
    return in_EAX;
  }
  iVar2 = dp->pos;
  if (dp->realSize < iVar2 + size) {
    if (dp->freeOK == 0) {
      return iVar2;
    }
    iVar1 = overflow2(dp->realSize,2);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar2 = gdReallocDynamic(dp,(iVar2 + size) * 2);
    if (iVar2 == 0) {
      dp->dataGood = 0;
      return 0;
    }
    iVar2 = dp->pos;
  }
  pvVar3 = memcpy((void *)((long)iVar2 + (long)dp->data),src,(long)size);
  iVar2 = size + dp->pos;
  dp->pos = iVar2;
  if (dp->logicalSize < iVar2) {
    dp->logicalSize = iVar2;
  }
  return (int)pvVar3;
}

Assistant:

static int appendDynamic(dynamicPtr * dp, const void *src, int size)
{
	int bytesNeeded;
	char *tmp;

	if(!dp->dataGood) {
		return FALSE;
	}

	/* bytesNeeded = dp->logicalSize + size; */
	bytesNeeded = dp->pos + size;

	if(bytesNeeded > dp->realSize) {
		/* 2.0.21 */
		if(!dp->freeOK) {
			return FALSE;
		}

		if(overflow2(dp->realSize, 2)) {
			return FALSE;
		}

		if(!gdReallocDynamic(dp, bytesNeeded * 2)) {
			dp->dataGood = FALSE;
			return FALSE;
		}
	}

	/* if we get here, we can be sure that we have enough bytes
	 * to copy safely */

	/*printf("Mem OK Size: %d, Pos: %d\n", dp->realSize, dp->pos); */

	tmp = (char *)dp->data;
	memcpy ((void *)(tmp + (dp->pos)), src, size);
	dp->pos += size;

	if(dp->pos > dp->logicalSize) {
		dp->logicalSize = dp->pos;
	};

	return TRUE;
}